

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O3

char * ucnv_getCanonicalName_63(char *alias,char *standard,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  char cVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  UBool UVar6;
  uint32_t uVar7;
  UErrorCode UVar8;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint32_t uVar17;
  ulong uVar18;
  uint uVar19;
  char *dst;
  bool bVar20;
  bool bVar21;
  uint32_t convStart;
  uint16_t *local_a8;
  char local_78 [72];
  
  UVar6 = haveAliasData(pErrorCode);
  if (UVar6 == '\0') {
    return (char *)0x0;
  }
  if (alias == (char *)0x0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (char *)0x0;
  }
  if (*alias == '\0') {
    return (char *)0x0;
  }
  uVar7 = getTagNumber(standard);
  uVar1 = (gMainTable.optionTable)->stringNormalizationType;
  dst = alias;
  if (uVar1 != 0) {
    sVar11 = strlen(alias);
    if (0x3b < sVar11) {
      UVar8 = U_BUFFER_OVERFLOW_ERROR;
      uVar19 = 0xffffffff;
      cVar2 = '\0';
LAB_00164efb:
      *pErrorCode = UVar8;
      goto LAB_00164eff;
    }
    dst = local_78;
    ucnv_io_stripASCIIForCompare_63(dst,alias);
  }
  puVar5 = gMainTable.normalizedStringTable;
  puVar4 = gMainTable.stringTable;
  puVar3 = gMainTable.aliasList;
  uVar19 = 0;
  uVar17 = gMainTable.untaggedConvArraySize;
  uVar9 = gMainTable.untaggedConvArraySize >> 1;
  do {
    if (uVar1 == 0) {
      iVar10 = ucnv_compareNames_63(dst,(char *)(puVar4 + puVar3[uVar9]));
    }
    else {
      iVar10 = strcmp(dst,(char *)(puVar5 + puVar3[uVar9]));
    }
    uVar14 = uVar9;
    if ((-1 < iVar10) && (uVar19 = uVar9, uVar14 = uVar17, iVar10 == 0)) {
      uVar19 = gMainTable.untaggedConvArray[uVar9] & 0xfff;
      if (-1 < (short)gMainTable.untaggedConvArray[uVar9]) goto LAB_00164ee0;
      UVar8 = U_AMBIGUOUS_ALIAS_WARNING;
      cVar2 = '\x01';
      goto LAB_00164efb;
    }
    uVar17 = uVar14;
    uVar14 = uVar17 + uVar19 >> 1;
    bVar20 = uVar9 != uVar14;
    uVar9 = uVar14;
  } while (bVar20);
  uVar19 = 0xffffffff;
LAB_00164ee0:
  cVar2 = '\0';
LAB_00164eff:
  uVar17 = gMainTable.converterListSize;
  puVar5 = gMainTable.stringTable;
  puVar4 = gMainTable.taggedAliasLists;
  puVar3 = gMainTable.taggedAliasArray;
  if ((uVar7 < gMainTable.tagListSize - 1) && (uVar19 < gMainTable.converterListSize)) {
    uVar9 = gMainTable.converterListSize * uVar7;
    uVar15 = (ulong)uVar9;
    uVar12 = (ulong)gMainTable.taggedAliasArray[uVar9 + uVar19];
    if ((uVar12 == 0) || (uVar18 = (ulong)gMainTable.taggedAliasLists[uVar12], uVar18 == 0)) {
      if (cVar2 == '\0') {
        return (char *)0x0;
      }
    }
    else {
      local_a8 = gMainTable.stringTable;
      bVar20 = true;
      uVar16 = 1;
      do {
        if (((ulong)puVar4[uVar12 + uVar16] != 0) &&
           (iVar10 = ucnv_compareNames_63(alias,(char *)(puVar5 + puVar4[uVar12 + uVar16])),
           iVar10 == 0)) break;
        bVar20 = uVar16 < uVar18;
        bVar21 = uVar16 != uVar18;
        uVar16 = uVar16 + 1;
      } while (bVar21);
      uVar14 = 0xffffffff;
      if (bVar20) {
        uVar14 = uVar19;
      }
      if (cVar2 != -1 || bVar20) {
LAB_001650b0:
        if (uVar17 <= uVar14) {
          return (char *)0x0;
        }
        return (char *)(local_a8 + gMainTable.converterList[uVar14]);
      }
    }
    puVar5 = gMainTable.stringTable;
    puVar4 = gMainTable.taggedAliasLists;
    uVar19 = (uVar7 + 1) * uVar17;
    if (uVar9 < uVar19) {
      local_a8 = gMainTable.stringTable;
      do {
        uVar12 = (ulong)puVar3[uVar15];
        if ((uVar12 != 0) && (uVar18 = (ulong)puVar4[uVar12], uVar18 != 0)) {
          bVar20 = true;
          uVar16 = 1;
          do {
            uVar13 = (ulong)puVar4[uVar12 + uVar16];
            if ((uVar13 != 0) &&
               (iVar10 = ucnv_compareNames_63(alias,(char *)(puVar5 + uVar13)), iVar10 == 0)) break;
            bVar20 = uVar16 < uVar18;
            bVar21 = uVar16 != uVar18;
            uVar16 = uVar16 + 1;
          } while (bVar21);
          if (bVar20) {
            uVar14 = (int)uVar15 - uVar9;
            goto LAB_001650b0;
          }
        }
        uVar15 = uVar15 + 1;
        if (uVar15 == uVar19) {
          return (char *)0x0;
        }
      } while( true );
    }
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char * U_EXPORT2
ucnv_getCanonicalName(const char *alias, const char *standard, UErrorCode *pErrorCode) {
    if (haveAliasData(pErrorCode) && isAlias(alias, pErrorCode)) {
        uint32_t convNum = findTaggedConverterNum(alias, standard, pErrorCode);

        if (convNum < gMainTable.converterListSize) {
            return GET_STRING(gMainTable.converterList[convNum]);
        }
    }

    return NULL;
}